

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::iLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  _Base_ptr p_Var2;
  double dVar3;
  char cVar4;
  Station *this_00;
  ostream *poVar5;
  _Base_ptr *pp_Var6;
  clock_t cVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000011;
  bool bVar9;
  long lVar10;
  _List_node_base *__node;
  _List_node_base *p_Var11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  size_t sVar15;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  undefined1 local_108 [16];
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  _Base_ptr p_Stack_e0;
  _Base_ptr local_d8;
  undefined4 local_cc;
  pointer local_c8;
  uint local_bc;
  pointer local_b8;
  ApertureILS *local_b0;
  Plan *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  _List_node_base *local_88;
  _List_node_base *local_80;
  size_t local_78;
  pointer local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  Collimator *local_58;
  size_t local_50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_48;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,verbose);
  local_80 = (_List_node_base *)max_time;
  this_00 = (Station *)Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (&local_48,(list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)this_00);
  local_f8 = (_Base_ptr)0x0;
  local_94 = this->ls_type;
  local_f0 = (_Base_ptr)0x0;
  local_108._0_8_ = (_Base_ptr)local_108;
  local_108._8_8_ = (_Base_ptr)local_108;
  local_b0 = this;
  local_a8 = P;
  local_c8 = (pointer)Plan::getEvaluation(P);
  if ((char)local_cc != '\0') {
    local_f0 = (_Base_ptr)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Staring intensity local search...",0x21);
    local_f0 = (_Base_ptr)0x0;
    cVar4 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    local_f0 = (_Base_ptr)0x0;
    this_00 = (Station *)(ulong)(uint)(int)cVar4;
    std::ostream::put(-0x78);
    local_f0 = (_Base_ptr)0x0;
    std::ostream::flush();
  }
  local_88 = (_List_node_base *)clock();
  local_58 = (Collimator *)&local_a8->w;
  local_60 = &local_a8->Zmin;
  local_68 = &local_a8->Zmax;
  local_9c = -1;
  p_Var11 = (_List_node_base *)0x0;
  iVar14 = -1;
  local_8c = -1;
  local_90 = -1;
  p_Var8 = (_Base_ptr)0x0;
LAB_00126c28:
  do {
    getShuffledIntensityNeighbors
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_e8,
               (ApertureILS *)this_00,local_a8);
    p_Var2 = p_Stack_e0;
    local_f0 = local_e8;
    local_e8 = (_Base_ptr)0x0;
    p_Stack_e0 = (_Base_ptr)0x0;
    local_d8 = (_Base_ptr)0x0;
    if (p_Var8 != (_Base_ptr)0x0) {
      operator_delete(p_Var8);
    }
    if (local_e8 != (_Base_ptr)0x0) {
      operator_delete(local_e8);
    }
    iVar14 = iVar14 + 1;
    if ((char)local_cc != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  iLS Neighborhood ",0x13);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," size ",6);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    current ",0xc);
      poVar5 = std::ostream::_M_insert<double>((double)local_c8);
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      this_00 = (Station *)(ulong)(uint)(int)cVar4;
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if ((long)p_Var2 - (long)local_f0 == 0) {
      local_bc = 0;
      bVar9 = false;
    }
    else {
      lVar10 = (long)p_Var2 - (long)local_f0 >> 3;
      local_78 = lVar10 - 1;
      local_50 = lVar10 + (ulong)(lVar10 == 0);
      sVar15 = 0;
      bVar9 = false;
      local_bc = 0;
      local_70 = local_c8;
      p_Var8 = local_f0;
      local_98 = iVar14;
      do {
        iVar14 = *(int *)(&(((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&p_Var8->_M_color)->_M_impl)._M_node.super__List_node_base._M_next +
                         sVar15);
        lVar10 = (long)iVar14;
        if ((iVar14 == local_8c) && (*(int *)(&p_Var8->field_0x4 + sVar15 * 8) == local_90)) {
          if (local_78 == sVar15) {
            bVar9 = true;
          }
        }
        else {
          p_Var11 = local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next;
          if (iVar14 < 1) {
            if (iVar14 != 0) {
              do {
                p_Var11 = p_Var11->_M_prev;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0);
            }
          }
          else {
            do {
              p_Var11 = p_Var11->_M_next;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          iVar14 = (int)sVar15;
          if ((char)local_cc != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  iLS Neighbor ",0xf);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," over station ",0xe);
            poVar5 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar5,*(int *)&(p_Var11[1]._M_next)->_M_prev);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," aperture ",10);
            iVar1 = *(int *)(&local_f0->field_0x4 + sVar15 * 8);
            iVar12 = -iVar1;
            if (0 < iVar1) {
              iVar12 = iVar1;
            }
            std::ostream::operator<<((ostream *)poVar5,iVar12 + -1);
          }
          if (*(int *)(&local_f0->field_0x4 + sVar15 * 8) < 0) {
            iVar1 = *(int *)(&local_f0->field_0x4 + sVar15 * 8);
            iVar12 = -iVar1;
            if (0 < iVar1) {
              iVar12 = iVar1;
            }
            Station::getModifyIntensityApertureDiff_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_e8,(Station *)p_Var11[1]._M_next,iVar12 + -1,
                       (double)-local_b0->step_intensity);
            p_Var8 = (_Base_ptr)local_108._0_8_;
            if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
              do {
                p_Var2 = *(_Base_ptr *)p_Var8;
                operator_delete(p_Var8);
                p_Var8 = p_Var2;
              } while (p_Var2 != (_Base_ptr)local_108);
            }
            local_f8 = (_Base_ptr)0x0;
            if (local_e8 == (_Base_ptr)&local_e8) {
              pp_Var6 = &local_f8;
              local_108._0_8_ = (_Base_ptr)local_108;
              local_108._8_8_ = (_Base_ptr)local_108;
            }
            else {
              local_108._0_8_ = local_e8;
              local_108._8_8_ = p_Stack_e0;
              *(undefined1 **)p_Stack_e0 = local_108;
              local_e8->_M_parent = (_Base_ptr)local_108;
              local_f8 = local_d8;
              pp_Var6 = &local_d8;
              local_e8 = (_Base_ptr)&local_e8;
              p_Stack_e0 = (_Base_ptr)&local_e8;
            }
            *pp_Var6 = (_Base_ptr)0x0;
            p_Var8 = local_e8;
            while (p_Var8 != (_Base_ptr)&local_e8) {
              p_Var2 = *(_Base_ptr *)p_Var8;
              operator_delete(p_Var8);
              p_Var8 = p_Var2;
            }
            this_00 = (Station *)local_108;
            dVar3 = EvaluationFunction::get_delta_eval
                              (local_a8->ev,
                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)local_108,(double)*(int *)&(p_Var11[1]._M_next)->_M_prev,
                               (vector<double,_std::allocator<double>_> *)local_58,local_60,local_68
                               ,999999);
            if (dVar3 <= (double)local_c8) {
              this_00 = (Station *)p_Var11[1]._M_next;
              iVar1 = *(int *)(&local_f0->field_0x4 + sVar15 * 8);
              iVar12 = -iVar1;
              if (0 < iVar1) {
                iVar12 = iVar1;
              }
              Station::modifyIntensityAperture_abi_cxx11_
                        ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         &local_e8,this_00,iVar12 + -1,(double)-local_b0->step_intensity);
              p_Var8 = (_Base_ptr)local_108._0_8_;
              if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
                do {
                  p_Var2 = *(_Base_ptr *)p_Var8;
                  operator_delete(p_Var8);
                  p_Var8 = p_Var2;
                } while (p_Var2 != (_Base_ptr)local_108);
              }
              local_f8 = (_Base_ptr)0x0;
              if (local_e8 == (_Base_ptr)&local_e8) {
                pp_Var6 = &local_f8;
                local_108._0_8_ = (_Base_ptr)local_108;
                local_108._8_8_ = (_Base_ptr)local_108;
              }
              else {
                local_108._0_8_ = local_e8;
                local_108._8_8_ = p_Stack_e0;
                *(undefined1 **)p_Stack_e0 = local_108;
                local_e8->_M_parent = (_Base_ptr)local_108;
                local_f8 = local_d8;
                pp_Var6 = &local_d8;
                local_e8 = (_Base_ptr)&local_e8;
                p_Stack_e0 = (_Base_ptr)&local_e8;
              }
              *pp_Var6 = (_Base_ptr)0x0;
              p_Var8 = local_e8;
              while (p_Var8 != (_Base_ptr)&local_e8) {
                p_Var2 = *(_Base_ptr *)p_Var8;
                operator_delete(p_Var8);
                p_Var8 = p_Var2;
              }
              local_b8 = local_c8;
              if (local_f8 != (_Base_ptr)0x0) {
                this_00 = (Station *)p_Var11[1]._M_next;
                local_b8 = (pointer)Plan::incremental_eval
                                              (local_a8,this_00,
                                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                *)local_108);
              }
            }
            else {
              Station::clearHistory((Station *)p_Var11[1]._M_next);
              local_b8 = local_c8;
            }
            if ((char)local_cc != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (-",3);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)&std::cout,local_b0->step_intensity);
              this_00 = (Station *)0x12d966;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            }
          }
          else {
            Station::getModifyIntensityApertureDiff_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_e8,(Station *)p_Var11[1]._M_next,
                       *(int *)(&local_f0->field_0x4 + sVar15 * 8) + -1,
                       (double)local_b0->step_intensity);
            p_Var8 = (_Base_ptr)local_108._0_8_;
            if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
              do {
                p_Var2 = *(_Base_ptr *)p_Var8;
                operator_delete(p_Var8);
                p_Var8 = p_Var2;
              } while (p_Var2 != (_Base_ptr)local_108);
            }
            local_f8 = (_Base_ptr)0x0;
            if (local_e8 == (_Base_ptr)&local_e8) {
              pp_Var6 = &local_f8;
              local_108._0_8_ = (_Base_ptr)local_108;
              local_108._8_8_ = (_Base_ptr)local_108;
            }
            else {
              local_108._0_8_ = local_e8;
              local_108._8_8_ = p_Stack_e0;
              *(undefined1 **)p_Stack_e0 = local_108;
              local_e8->_M_parent = (_Base_ptr)local_108;
              local_f8 = local_d8;
              pp_Var6 = &local_d8;
              local_e8 = (_Base_ptr)&local_e8;
              p_Stack_e0 = (_Base_ptr)&local_e8;
            }
            *pp_Var6 = (_Base_ptr)0x0;
            p_Var8 = local_e8;
            while (p_Var8 != (_Base_ptr)&local_e8) {
              p_Var2 = *(_Base_ptr *)p_Var8;
              operator_delete(p_Var8);
              p_Var8 = p_Var2;
            }
            this_00 = (Station *)local_108;
            dVar3 = EvaluationFunction::get_delta_eval
                              (local_a8->ev,
                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)local_108,(double)*(int *)&(p_Var11[1]._M_next)->_M_prev,
                               (vector<double,_std::allocator<double>_> *)local_58,local_60,local_68
                               ,999999);
            if (dVar3 <= (double)local_c8) {
              this_00 = (Station *)p_Var11[1]._M_next;
              Station::modifyIntensityAperture_abi_cxx11_
                        ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         &local_e8,this_00,*(int *)(&local_f0->field_0x4 + sVar15 * 8) + -1,
                         (double)local_b0->step_intensity);
              p_Var8 = (_Base_ptr)local_108._0_8_;
              if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
                do {
                  p_Var2 = *(_Base_ptr *)p_Var8;
                  operator_delete(p_Var8);
                  p_Var8 = p_Var2;
                } while (p_Var2 != (_Base_ptr)local_108);
              }
              local_f8 = (_Base_ptr)0x0;
              if (local_e8 == (_Base_ptr)&local_e8) {
                pp_Var6 = &local_f8;
                local_108._0_8_ = (_Base_ptr)local_108;
                local_108._8_8_ = (_Base_ptr)local_108;
              }
              else {
                local_108._0_8_ = local_e8;
                local_108._8_8_ = p_Stack_e0;
                *(undefined1 **)p_Stack_e0 = local_108;
                local_e8->_M_parent = (_Base_ptr)local_108;
                local_f8 = local_d8;
                pp_Var6 = &local_d8;
                local_e8 = (_Base_ptr)&local_e8;
                p_Stack_e0 = (_Base_ptr)&local_e8;
              }
              *pp_Var6 = (_Base_ptr)0x0;
              p_Var8 = local_e8;
              while (p_Var8 != (_Base_ptr)&local_e8) {
                p_Var2 = *(_Base_ptr *)p_Var8;
                operator_delete(p_Var8);
                p_Var8 = p_Var2;
              }
              local_b8 = local_c8;
              if (local_f8 != (_Base_ptr)0x0) {
                this_00 = (Station *)p_Var11[1]._M_next;
                local_b8 = (pointer)Plan::incremental_eval
                                              (local_a8,this_00,
                                               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                *)local_108);
              }
            }
            else {
              Station::clearHistory((Station *)p_Var11[1]._M_next);
              local_b8 = local_c8;
            }
            if ((char)local_cc != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (+",3);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)&std::cout,local_b0->step_intensity);
              this_00 = (Station *)0x12d966;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            }
          }
          if ((char)local_cc != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," result ",8);
            poVar5 = std::ostream::_M_insert<double>((double)local_b8);
            cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            this_00 = (Station *)(ulong)(uint)(int)cVar4;
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          if (1e-05 < (double)local_70 - (double)local_b8) {
            if ((char)local_cc != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"     improvement ",0x11);
              poVar5 = std::ostream::_M_insert<double>((double)local_b8);
              cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5)
              ;
              this_00 = (Station *)(ulong)(uint)(int)cVar4;
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
            local_90 = -*(int *)(&local_f0->field_0x4 + sVar15 * 8);
            local_8c = *(int *)(&(((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    *)&local_f0->_M_color)->_M_impl)._M_node.super__List_node_base.
                                 _M_next + sVar15);
            local_9c = iVar14;
            if (local_94 == 0) {
              if (local_78 == sVar15) {
                bVar9 = true;
              }
              local_bc = (uint)CONCAT71((uint7)(uint3)((uint)local_90 >> 8),1);
              local_c8 = local_b8;
              iVar14 = local_98;
              goto LAB_001275b0;
            }
            local_bc = (uint)CONCAT71((uint7)(uint3)((uint)local_8c >> 8),1);
            local_70 = local_b8;
          }
          this_00 = (Station *)p_Var11[1]._M_next;
          Station::undoLast_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_e8,this_00);
          p_Var8 = (_Base_ptr)local_108._0_8_;
          if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
            do {
              p_Var2 = *(_Base_ptr *)p_Var8;
              operator_delete(p_Var8);
              p_Var8 = p_Var2;
            } while (p_Var2 != (_Base_ptr)local_108);
          }
          local_f8 = (_Base_ptr)0x0;
          if (local_e8 == (_Base_ptr)&local_e8) {
            pp_Var6 = &local_f8;
            local_108._0_8_ = (_Base_ptr)local_108;
            local_108._8_8_ = (_Base_ptr)local_108;
          }
          else {
            local_108._0_8_ = local_e8;
            local_108._8_8_ = p_Stack_e0;
            *(undefined1 **)p_Stack_e0 = local_108;
            local_e8->_M_parent = (_Base_ptr)local_108;
            local_f8 = local_d8;
            pp_Var6 = &local_d8;
            local_e8 = (_Base_ptr)&local_e8;
            p_Stack_e0 = (_Base_ptr)&local_e8;
          }
          *pp_Var6 = (_Base_ptr)0x0;
          p_Var8 = local_e8;
          while (p_Var8 != (_Base_ptr)&local_e8) {
            p_Var2 = *(_Base_ptr *)p_Var8;
            operator_delete(p_Var8);
            p_Var8 = p_Var2;
          }
          if (local_f8 != (_Base_ptr)0x0) {
            this_00 = (Station *)p_Var11[1]._M_next;
            Plan::incremental_eval
                      (local_a8,this_00,
                       (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       local_108);
          }
          if (local_78 == sVar15) {
            bVar9 = true;
          }
          cVar7 = clock();
          p_Var8 = local_f0;
          if ((((double)local_80 != 0.0) || (NAN((double)local_80))) &&
             ((double)local_80 <= (double)(cVar7 - (long)local_88) / 1000000.0)) break;
        }
        sVar15 = sVar15 + 1;
      } while (sVar15 != local_50);
      local_c8 = local_70;
      iVar14 = local_98;
    }
LAB_001275b0:
    if ((local_94 != 0 & (byte)local_bc) == 1) {
      lVar10 = (long)local_9c;
      if (*(int *)(&local_f0->field_0x4 + lVar10 * 8) < 0) {
        iVar1 = *(int *)(&local_f0->field_0x4 + lVar10 * 8);
        iVar12 = -iVar1;
        if (0 < iVar1) {
          iVar12 = iVar1;
        }
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_e8,(Station *)p_Var11[1]._M_next,iVar12 + -1,
                   (double)-local_b0->step_intensity);
        p_Var8 = (_Base_ptr)local_108._0_8_;
        if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
          do {
            p_Var2 = *(_Base_ptr *)p_Var8;
            operator_delete(p_Var8);
            p_Var8 = p_Var2;
          } while (p_Var2 != (_Base_ptr)local_108);
        }
        local_f8 = (_Base_ptr)0x0;
        if (local_e8 == (_Base_ptr)&local_e8) {
          pp_Var6 = &local_f8;
          local_108._0_8_ = (_Base_ptr)local_108;
          local_108._8_8_ = (_Base_ptr)local_108;
        }
        else {
          local_108._0_8_ = local_e8;
          local_108._8_8_ = p_Stack_e0;
          *(undefined1 **)p_Stack_e0 = local_108;
          local_e8->_M_parent = (_Base_ptr)local_108;
          local_f8 = local_d8;
          pp_Var6 = &local_d8;
          local_e8 = (_Base_ptr)&local_e8;
          p_Stack_e0 = (_Base_ptr)&local_e8;
        }
        *pp_Var6 = (_Base_ptr)0x0;
        p_Var8 = local_e8;
        while (p_Var8 != (_Base_ptr)&local_e8) {
          p_Var2 = *(_Base_ptr *)p_Var8;
          operator_delete(p_Var8);
          p_Var8 = p_Var2;
        }
      }
      else {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_e8,(Station *)p_Var11[1]._M_next,
                   *(int *)(&local_f0->field_0x4 + lVar10 * 8) + -1,(double)local_b0->step_intensity
                  );
        p_Var8 = (_Base_ptr)local_108._0_8_;
        if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
          do {
            p_Var2 = *(_Base_ptr *)p_Var8;
            operator_delete(p_Var8);
            p_Var8 = p_Var2;
          } while (p_Var2 != (_Base_ptr)local_108);
        }
        local_f8 = (_Base_ptr)0x0;
        if (local_e8 == (_Base_ptr)&local_e8) {
          pp_Var6 = &local_f8;
          local_108._0_8_ = (_Base_ptr)local_108;
          local_108._8_8_ = (_Base_ptr)local_108;
        }
        else {
          local_108._0_8_ = local_e8;
          local_108._8_8_ = p_Stack_e0;
          *(undefined1 **)p_Stack_e0 = local_108;
          local_e8->_M_parent = (_Base_ptr)local_108;
          local_f8 = local_d8;
          pp_Var6 = &local_d8;
          local_e8 = (_Base_ptr)&local_e8;
          p_Stack_e0 = (_Base_ptr)&local_e8;
        }
        *pp_Var6 = (_Base_ptr)0x0;
        p_Var8 = local_e8;
        while (p_Var8 != (_Base_ptr)&local_e8) {
          p_Var2 = *(_Base_ptr *)p_Var8;
          operator_delete(p_Var8);
          p_Var8 = p_Var2;
        }
      }
      this_00 = (Station *)p_Var11[1]._M_next;
      Plan::incremental_eval
                (local_a8,this_00,
                 (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_108
                );
    }
    cVar7 = clock();
    p_Var8 = local_f0;
    if (((double)local_80 == 0.0) && (!NAN((double)local_80))) {
      if ((local_bc & 1) == 0) goto LAB_001277c8;
      goto LAB_00126c28;
    }
    if (((byte)local_bc & (double)(cVar7 - (long)local_88) / 1000000.0 < (double)local_80) == 0) {
LAB_001277c8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  iLS best: ",0xc);
      std::ostream::_M_insert<double>((double)local_c8);
      pcVar13 = ": [nolo] : ";
      if (bVar9) {
        pcVar13 = ": [lo] : ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar13,(ulong)((byte)~bVar9 & 1) * 2 + 9);
      cVar7 = clock();
      poVar5 = std::ostream::_M_insert<double>((double)local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," :",2);
      poVar5 = std::ostream::_M_insert<double>((double)(cVar7 - (long)local_88) / 1000000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_f0 != (_Base_ptr)0x0) {
        operator_delete(local_f0);
      }
      p_Var8 = (_Base_ptr)local_108._0_8_;
      if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)local_108) {
        do {
          p_Var2 = *(_Base_ptr *)p_Var8;
          operator_delete(p_Var8);
          p_Var8 = p_Var2;
        } while (p_Var2 != (_Base_ptr)local_108);
      }
      while (local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
        p_Var11 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next;
        operator_delete(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>
                        ._M_impl._M_node.super__List_node_base._M_next);
        local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node
        .super__List_node_base._M_next = p_Var11;
      }
      return (double)local_c8;
    }
  } while( true );
}

Assistant:

double ApertureILS::iLocalSearch (Plan& P,  double max_time, bool verbose) {
    list<Station*> stations = P.get_stations();
    list<Station*>::iterator s;
    
    std::clock_t time_end, time_begin;
    double used_time; 
    
    double local_best_eval, current_eval, aux_eval;
    list<pair<int, double> > diff;
    vector<pair<int, int>> a_list;
    pair <int,int> tabu;
    
    bool improvement = true;
    bool best_improvement=ls_type;
    bool completed = false;
    int i, j, best_n;
    
    tabu = make_pair(-1,-1);
    best_n = -1;
    j=-1;
    local_best_eval = current_eval = aux_eval = P.getEvaluation();
    
    if (verbose)
      cout << "Staring intensity local search..." << endl;
    time_begin=clock();
    
    // Main local search loop
    while (improvement) {
      improvement = false;
      completed = false;
      j++;
      current_eval = local_best_eval;
      a_list = getShuffledIntensityNeighbors(P);

      if (verbose) {
        cout << "  iLS Neighborhood "<< j << " size "<< a_list.size() << "    current " << local_best_eval << endl;
      }
      
      // Check all the neighbors
      for (i = 0; i < a_list.size(); i++) {
         //skip the tabu neighbor (returns the station to previous state)
         if (a_list[i].first == tabu.first && a_list[i].second == tabu.second) {
           if (i == (a_list.size()-1)) completed = true;
           continue;
         }
         //get the station of the movement
         s = stations.begin();
         std::advance(s, a_list[i].first);
         
         if (verbose)
             cout << "  iLS Neighbor " << i << " over station " << (*s)->getAngle() << " aperture " <<  abs(a_list[i].second)-1;
         
         aux_eval = current_eval;
         
         //apply step_size intensity change (-(a+1) or +(a+1))
         if (a_list[i].second < 0 ){
           diff = (*s)->getModifyIntensityApertureDiff(abs(a_list[i].second)-1, -step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(abs(a_list[i].second)-1, -step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (-" << step_intensity << ")";
         } else {
           diff = (*s)->getModifyIntensityApertureDiff(a_list[i].second-1, step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(a_list[i].second-1, step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (+"<< step_intensity << ")";
         }
         
         if (verbose )
             cout << " result " << aux_eval <<endl;
         // First improvement
         if ((local_best_eval - aux_eval) > 0.00001){
           local_best_eval = aux_eval;
           best_n = i;
           improvement = true;
           if (verbose)
             cout << "     improvement " << aux_eval << endl ;
           
           
           // Add a tabu movement since we found improvement
           tabu.first = a_list[i].first;
           tabu.second = -1*a_list[i].second;
           
           // If first improvement has been chosen break and 
           if (!best_improvement) { 
             if (i==(a_list.size()-1)) completed = true;
             break;
           }
         }
         
         // Undo movement to continue the search
         diff = (*s)->undoLast();
         if (diff.size()>0)
           aux_eval = P.incremental_eval(*(*s), diff);
         
         if (i == (a_list.size()-1)) completed = true;
         
         time_end = clock();
         used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
         if (max_time!=0 && used_time >= max_time) {
           break;
         }
       } 
      
       //Apply best neighbor
       if (improvement && best_improvement) {
         if (a_list[best_n].second < 0 ){
           diff = (*s)->modifyIntensityAperture(abs(a_list[best_n].second)-1, -step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         } else {
           diff = (*s)->modifyIntensityAperture(a_list[best_n].second-1, step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         }
       }
       
       time_end = clock();
       used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
       if (max_time!=0 && used_time >= max_time) {
         break;
       }
    }
    
    cout << "  iLS best: " << local_best_eval ;
    if (!completed) cout << ": [nolo] : ";
    else  cout << ": [lo] : ";
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << max_time << " :" << used_time << endl;
    return(local_best_eval);
}